

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O0

void __thiscall OpenMD::Integrator::initialize(Integrator *this)

{
  bool bVar1;
  uint uVar2;
  SnapshotManager *pSVar3;
  long lVar4;
  long *in_RDI;
  RealType RVar5;
  StatWriter *in_stack_00000110;
  DumpWriter *in_stack_000001a0;
  RealType in_stack_00000238;
  Velocitizer *in_stack_00000240;
  ForceManager *in_stack_00000260;
  Stats *in_stack_00000900;
  unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>
  *in_stack_ffffffffffffffb8;
  RNEMD *in_stack_ffffffffffffffc0;
  double dVar6;
  Rattle *in_stack_ffffffffffffffd0;
  
  ForceManager::initialize(in_stack_00000260);
  bVar1 = Globals::getConserveLinearMomentum((Globals *)0x2016fd);
  if (bVar1) {
    std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator->
              ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
               0x201714);
    Velocitizer::removeComDrift((Velocitizer *)this);
  }
  (**(code **)(*(long *)in_RDI[0x12] + 0x10))();
  (**(code **)(*in_RDI + 0x28))();
  uVar2 = SimInfo::getNGlobalConstraints((SimInfo *)in_stack_ffffffffffffffc0);
  if (uVar2 != 0) {
    Rattle::constraintA(in_stack_ffffffffffffffd0);
    (**(code **)(*in_RDI + 0x28))();
    Rattle::constraintB((Rattle *)this);
    pSVar3 = SimInfo::getSnapshotManager((SimInfo *)in_RDI[0xe]);
    (*pSVar3->_vptr_SnapshotManager[2])();
  }
  if ((*(byte *)((long)in_RDI + 0xb3) & 1) != 0) {
    std::unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>::operator->
              ((unique_ptr<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_> *)
               0x2017af);
    Velocitizer::randomize(in_stack_00000240,in_stack_00000238);
  }
  lVar4 = (**(code **)(*in_RDI + 0x58))();
  in_RDI[0x19] = lVar4;
  lVar4 = (**(code **)(*in_RDI + 0x60))();
  in_RDI[0x1a] = lVar4;
  DumpWriter::writeDumpAndEor(in_stack_000001a0);
  std::make_unique<OpenMD::ProgressBar>();
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::operator=
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>::~unique_ptr
            ((unique_ptr<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_> *)
             in_stack_ffffffffffffffc0);
  saveConservedQuantity((Integrator *)in_stack_ffffffffffffffc0);
  Stats::collectStats(in_stack_00000900);
  if ((*(byte *)((long)in_RDI + 0xb4) & 1) != 0) {
    std::unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_>::operator->
              ((unique_ptr<OpenMD::RNEMD::RNEMD,_std::default_delete<OpenMD::RNEMD::RNEMD>_> *)
               0x201860);
    RNEMD::RNEMD::getStarted(in_stack_ffffffffffffffc0);
  }
  StatWriter::writeStat(in_stack_00000110);
  dVar6 = (double)in_RDI[4];
  RVar5 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
  in_RDI[9] = (long)(dVar6 + RVar5);
  dVar6 = (double)in_RDI[5];
  RVar5 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
  in_RDI[10] = (long)(dVar6 + RVar5);
  dVar6 = (double)in_RDI[6];
  RVar5 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
  in_RDI[0xb] = (long)(dVar6 + RVar5);
  if ((*(byte *)((long)in_RDI + 0xb2) & 1) != 0) {
    dVar6 = (double)in_RDI[7];
    RVar5 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
    in_RDI[0xc] = (long)(dVar6 + RVar5);
  }
  if ((*(byte *)((long)in_RDI + 0xb4) & 1) != 0) {
    dVar6 = (double)in_RDI[8];
    RVar5 = Snapshot::getTime((Snapshot *)in_RDI[0x1c]);
    in_RDI[0xd] = (long)(dVar6 + RVar5);
  }
  *(undefined1 *)(in_RDI + 0x16) = 0;
  *(undefined1 *)((long)in_RDI + 0xb1) = 0;
  return;
}

Assistant:

void Integrator::initialize() {
    forceMan_->initialize();

    // remove center of mass drift velocity (in case we passed in a
    // configuration that was drifting)
    if (simParams->getConserveLinearMomentum()) velocitizer_->removeComDrift();

    // find the initial fluctuating charges.
    flucQ_->initialize();
    // initialize the forces before the first step
    calcForce();
    // execute the constraint algorithm to make sure that the system is
    // constrained at the very beginning
    if (info_->getNGlobalConstraints() > 0) {
      rattle_->constraintA();
      calcForce();
      rattle_->constraintB();
      // copy the current snapshot to previous snapshot
      info_->getSnapshotManager()->advance();
    }

    if (needVelocityScaling) { velocitizer_->randomize(targetScalingTemp); }

    dumpWriter = createDumpWriter();
    statWriter = createStatWriter();
    dumpWriter->writeDumpAndEor();

    progressBar = std::make_unique<ProgressBar>();

    // save statistics, before writeStat,  we must save statistics
    saveConservedQuantity();
    stats->collectStats();

    if (useRNEMD) rnemd_->getStarted();

    statWriter->writeStat();

    currSample  = sampleTime + snap->getTime();
    currStatus  = statusTime + snap->getTime();
    currThermal = thermalTime + snap->getTime();
    if (needReset) { currReset = resetTime + snap->getTime(); }
    if (useRNEMD) { currRNEMD = RNEMD_exchangeTime + snap->getTime(); }
    needPotential = false;
    needVirial    = false;
  }